

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool aedit_create(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  AREA_DATA *pAVar2;
  char *txt;
  
  iVar1 = get_security(ch);
  if (iVar1 < 9) {
    txt = "You do not have the security to do that.\n\r";
  }
  else {
    pAVar2 = new_area();
    area_last->next = pAVar2;
    area_last = pAVar2;
    ch->desc->pEdit = pAVar2;
    *(byte *)pAVar2->area_flags = (byte)pAVar2->area_flags[0] | 0x10;
    txt = "Area Created.\n\r";
  }
  send_to_char(txt,ch);
  return false;
}

Assistant:

bool aedit_create(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;

	if (get_security(ch) < 9)
	{
		send_to_char("You do not have the security to do that.\n\r", ch);
		return false;
	}

	pArea = new_area();
	area_last->next = pArea;
	area_last = pArea; /* Thanks, Walker. */
	ch->desc->pEdit = (void *)pArea;

	SET_BIT(pArea->area_flags, AREA_ADDED);
	send_to_char("Area Created.\n\r", ch);
	return false;
}